

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O0

void save_pick(memfile *mf)

{
  uint local_18;
  int8_t local_12;
  int8_t local_11;
  uint box_id;
  schar door_y;
  schar door_x;
  memfile *mf_local;
  
  local_11 = '\0';
  local_12 = '\0';
  local_18 = 0;
  if (xlock.usedtime != 0) {
    if (xlock.door == (rm *)0x0) {
      local_18 = (xlock.box)->o_id;
    }
    else if ((level->locations <= xlock.door) &&
            (xlock.door < (rm *)((long)level->objects[1] + 0x54))) {
      local_11 = (int8_t)((((long)level + (0x40 - (long)xlock.door)) / 0xc) % 0x50);
      local_12 = (int8_t)(((long)level + (0x40 - (long)xlock.door)) / 0x3c0);
    }
  }
  mwrite32(mf,xlock.picktyp);
  mwrite32(mf,xlock.chance);
  mwrite32(mf,xlock.usedtime);
  mwrite8(mf,xlock.loot_unlocked);
  mwrite8(mf,local_11);
  mwrite8(mf,local_12);
  mwrite32(mf,local_18);
  mwrite8(mf,picklock_dx);
  mwrite8(mf,picklock_dy);
  return;
}

Assistant:

void save_pick(struct memfile *mf)
{
	schar door_x = 0;
	schar door_y = 0;
	unsigned int box_id = 0;

	/* avoid dereferencing dangling pointers here */
	if (xlock.usedtime) {
	    if (xlock.door) {
		/* make sure the door is on the current level */
		if (&level->locations[0][0] <= xlock.door &&
		    xlock.door < &level->locations[COLNO][ROWNO]) {
		    door_x = (&level->locations[0][0] - xlock.door) % COLNO;
		    door_y = (&level->locations[0][0] - xlock.door) / COLNO;
		}
	    } else {
		box_id = xlock.box->o_id;
	    }
	}

	mwrite32(mf, xlock.picktyp);
	mwrite32(mf, xlock.chance);
	mwrite32(mf, xlock.usedtime);
	mwrite8(mf, xlock.loot_unlocked);
	mwrite8(mf, door_x);
	mwrite8(mf, door_y);
	mwrite32(mf, box_id);

	mwrite8(mf, picklock_dx);
	mwrite8(mf, picklock_dy);
}